

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *tag,size_t tag_len)

{
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uchar work_buf [16];
  byte abStack_1d0 [384];
  undefined8 uStack_50;
  byte local_48 [24];
  
  iVar4 = -0x14;
  if (0xfffffffffffffff2 < tag_len - 0x11) {
    lVar5 = ctx->len << 3;
    lVar3 = ctx->add_len << 3;
    uStack_50 = 0x106035;
    memcpy(tag,ctx->base_ectr,tag_len);
    iVar4 = 0;
    if (lVar5 != 0 || lVar3 != 0) {
      local_48[1] = (char)((ulong)lVar3 >> 0x30);
      local_48[0] = (char)((ulong)lVar3 >> 0x38);
      local_48[2] = (char)((ulong)lVar3 >> 0x28);
      local_48[3] = (char)((ulong)lVar3 >> 0x20);
      local_48[4] = (char)((ulong)lVar3 >> 0x18);
      local_48[5] = (char)((ulong)lVar3 >> 0x10);
      local_48[6] = (char)((ulong)lVar3 >> 8);
      local_48[7] = (char)lVar3;
      local_48[9] = (char)((ulong)lVar5 >> 0x30);
      local_48[8] = (char)((ulong)lVar5 >> 0x38);
      local_48[10] = (char)((ulong)lVar5 >> 0x28);
      local_48[0xb] = (char)((ulong)lVar5 >> 0x20);
      local_48[0xc] = (char)((ulong)lVar5 >> 0x18);
      local_48[0xd] = (char)((ulong)lVar5 >> 0x10);
      local_48[0xe] = (char)((ulong)lVar5 >> 8);
      local_48[0xf] = (char)lVar5;
      lVar3 = 0x188;
      do {
        puVar1 = (ctx->cipher_ctx).unprocessed_data + lVar3 + -0x20;
        *puVar1 = *puVar1 ^ abStack_1d0[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x198);
      puVar1 = ctx->buf;
      uStack_50 = 0x10610a;
      gcm_mult(ctx,puVar1,puVar1);
      iVar4 = 0;
      if (tag_len != 0) {
        iVar4 = 0;
        sVar2 = 0;
        do {
          tag[sVar2] = tag[sVar2] ^ puVar1[sVar2];
          sVar2 = sVar2 + 1;
        } while (tag_len != sVar2);
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_gcm_finish( mbedtls_gcm_context *ctx,
                unsigned char *tag,
                size_t tag_len )
{
    unsigned char work_buf[16];
    size_t i;
    uint64_t orig_len = ctx->len * 8;
    uint64_t orig_add_len = ctx->add_len * 8;

    if( tag_len > 16 || tag_len < 4 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    memcpy( tag, ctx->base_ectr, tag_len );

    if( orig_len || orig_add_len )
    {
        memset( work_buf, 0x00, 16 );

        PUT_UINT32_BE( ( orig_add_len >> 32 ), work_buf, 0  );
        PUT_UINT32_BE( ( orig_add_len       ), work_buf, 4  );
        PUT_UINT32_BE( ( orig_len     >> 32 ), work_buf, 8  );
        PUT_UINT32_BE( ( orig_len           ), work_buf, 12 );

        for( i = 0; i < 16; i++ )
            ctx->buf[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        for( i = 0; i < tag_len; i++ )
            tag[i] ^= ctx->buf[i];
    }

    return( 0 );
}